

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

const_iterator __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::find(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
       *this,QPushButton **key)

{
  long lVar1;
  bool bVar2;
  QPushButton **ppQVar3;
  QPushButton **in_RSI;
  less<QPushButton_*> *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_stack_ffffffffffffffa8;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *this_00;
  const_iterator local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = lower_bound((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                          *)in_RDI,in_RSI);
  end(in_stack_ffffffffffffffa8);
  bVar2 = const_iterator::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar2) {
    this_00 = (QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
               *)*in_RSI;
    ppQVar3 = const_iterator::key((const_iterator *)0x6765d6);
    bVar2 = std::less<QPushButton_*>::operator()(in_RDI,(QPushButton *)this_00,*ppQVar3);
    if (bVar2) {
      local_18 = end(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }